

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

void add_pair_to_block(EState *s)

{
  uint uVar1;
  UChar UVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  UInt32 UVar6;
  
  uVar1 = s->state_in_ch;
  uVar3 = (ulong)uVar1;
  iVar4 = s->state_in_len;
  UVar2 = (UChar)uVar1;
  if (0 < (long)iVar4) {
    UVar6 = s->blockCRC;
    iVar5 = iVar4;
    do {
      UVar6 = UVar6 << 8 ^ BZ2_crc32Table[UVar6 >> 0x18 ^ uVar1 & 0xff];
      s->blockCRC = UVar6;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  s->inUse[uVar3] = '\x01';
  if (iVar4 == 3) {
    s->block[s->nblock] = UVar2;
    iVar4 = s->nblock;
    s->nblock = iVar4 + 1;
    s->block[(long)iVar4 + 1] = UVar2;
  }
  else {
    if (iVar4 != 2) {
      if (iVar4 == 1) {
        iVar4 = s->nblock;
      }
      else {
        s->inUse[(long)iVar4 + -4] = '\x01';
        s->block[s->nblock] = UVar2;
        iVar4 = s->nblock;
        s->nblock = iVar4 + 1;
        s->block[(long)iVar4 + 1] = UVar2;
        iVar4 = s->nblock;
        s->nblock = iVar4 + 1;
        s->block[(long)iVar4 + 1] = UVar2;
        iVar4 = s->nblock;
        s->nblock = iVar4 + 1;
        s->block[(long)iVar4 + 1] = UVar2;
        iVar4 = s->nblock + 1;
        s->nblock = iVar4;
        uVar3 = (ulong)(byte)((char)s->state_in_len - 4);
      }
      goto LAB_004a1b77;
    }
    s->block[s->nblock] = UVar2;
  }
  iVar4 = s->nblock + 1;
  s->nblock = iVar4;
LAB_004a1b77:
  s->block[iVar4] = (UChar)uVar3;
  s->nblock = s->nblock + 1;
  return;
}

Assistant:

static
void add_pair_to_block ( EState* s )
{
   Int32 i;
   UChar ch = (UChar)(s->state_in_ch);
   for (i = 0; i < s->state_in_len; i++) {
      BZ_UPDATE_CRC( s->blockCRC, ch );
   }
   s->inUse[s->state_in_ch] = True;
   switch (s->state_in_len) {
      case 1:
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         break;
      case 2:
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         break;
      case 3:
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         break;
      default:
         s->inUse[s->state_in_len-4] = True;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = ((UChar)(s->state_in_len-4));
         s->nblock++;
         break;
   }
}